

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::UpdateManifestMapItemDestination
          (ON_BinaryArchive *this,ON_ManifestMapItem *map_item)

{
  bool bVar1;
  Type TVar2;
  archive_mode aVar3;
  bool bIgnoreSourceIndex;
  ON_ManifestMapItem *map_item_local;
  ON_BinaryArchive *this_local;
  
  aVar3 = Mode(this);
  if (aVar3 == read3dm) {
    bVar1 = ON_ManifestMapItem::SourceIsUnset(map_item);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0xd67,"","map_item source information is not set.");
      this_local._7_1_ = false;
    }
    else {
      TVar2 = ON_ManifestMapItem::ComponentType(map_item);
      this_local._7_1_ =
           ON_ManifestMap::UpdatetMapItemDestination(&this->m_manifest_map,map_item,TVar2 == Group);
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xd62,"","archive mode != ON::archive_mode::read3dm");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::UpdateManifestMapItemDestination(
  const class ON_ManifestMapItem& map_item
  )
{
  if (ON::archive_mode::read3dm != this->Mode())
  {
    ON_ERROR("archive mode != ON::archive_mode::read3dm");
    return false;
  }
  if (map_item.SourceIsUnset())
  {
    ON_ERROR("map_item source information is not set.");
    return false;
  }

  const bool bIgnoreSourceIndex = (ON_ModelComponent::Type::Group == map_item.ComponentType());

  return m_manifest_map.UpdatetMapItemDestination(map_item, bIgnoreSourceIndex);
}